

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_derived_*const_&,_const_base_*const_&> * __thiscall
Catch::ExprLhs<C_A_T_C_H_T_E_S_T_0()::derived_const*const&>::operator==
          (BinaryExpr<const_derived_*const_&,_const_base_*const_&> *__return_storage_ptr__,
          ExprLhs<C_A_T_C_H_T_E_S_T_0()::derived_const*const&> *this,base **rhs)

{
  derived **lhs;
  bool comparisonResult;
  StringRef local_30;
  base **local_20;
  base **rhs_local;
  ExprLhs<const_derived_*const_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (base **)this;
  this_local = (ExprLhs<const_derived_*const_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<C_A_T_C_H_T_E_S_T_0()::derived_const*,C_A_T_C_H_T_E_S_T_0()::base_const*>
                 (*(derived ***)this,rhs);
  lhs = *(derived ***)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_derived_*const_&,_const_base_*const_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }